

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::Write(DBImpl *this,WriteOptions *options,WriteBatch *updates)

{
  pthread_mutex_t *__mutex;
  Writer *pWVar1;
  long lVar2;
  Writer *pWVar3;
  _func_int **pp_Var4;
  _Alloc_hider _Var5;
  int iVar6;
  _func_int **pp_Var7;
  MemTable *b;
  char *pcVar8;
  long in_RCX;
  ulong uVar9;
  long lVar10;
  bool bVar11;
  Writer *last_writer;
  Writer w;
  WriteBatch local_c0;
  Writer *local_a0;
  WriteBatch *local_98;
  undefined1 local_90 [8];
  Writer local_88;
  
  __mutex = (pthread_mutex_t *)(options + 200);
  local_88.status.state_ = (char *)0x0;
  local_88.batch = (WriteBatch *)0x0;
  local_88.sync = false;
  local_88.done = false;
  port::CondVar::CondVar(&local_88.cv,(Mutex *)&__mutex->__data);
  local_88.done = false;
  local_88.sync = (bool)*(byte *)&(updates->rep_)._M_dataplus._M_p;
  iVar6 = pthread_mutex_lock(__mutex);
  if (iVar6 == 0) {
    local_c0.rep_._M_dataplus._M_p = (pointer)&local_88;
    local_98 = updates;
    if (*(long **)(options + 0x198) == (long *)(*(long *)(options + 0x1a8) + -8)) {
      std::deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>>::
      _M_push_back_aux<leveldb::DBImpl::Writer*>
                ((deque<leveldb::DBImpl::Writer*,std::allocator<leveldb::DBImpl::Writer*>> *)
                 (options + 0x168),(Writer **)&local_c0);
    }
    else {
      **(long **)(options + 0x198) = (long)&local_88;
      *(long *)(options + 0x198) = *(long *)(options + 0x198) + 8;
    }
    if (local_88.done == false) {
      pWVar1 = (Writer *)**(long **)(options + 0x178);
      _Var5._M_p = local_c0.rep_._M_dataplus._M_p;
      local_c0.rep_._M_dataplus._M_p = (pointer)local_88.cv.mu_;
      while (&local_88 != pWVar1) {
        uVar9 = local_c0.rep_._M_string_length >> 8;
        local_c0.rep_._M_string_length = CONCAT71((int7)uVar9,1);
        local_88.cv.mu_ = (Mutex *)local_c0.rep_._M_dataplus._M_p;
        std::condition_variable::wait((unique_lock *)&local_88.cv);
        if (local_88.done != false) goto LAB_0013a6f1;
        _Var5._M_p = local_c0.rep_._M_dataplus._M_p;
        local_c0.rep_._M_dataplus._M_p = (pointer)local_88.cv.mu_;
        pWVar1 = (Writer *)**(long **)(options + 0x178);
      }
      local_c0.rep_._M_dataplus._M_p = _Var5._M_p;
      MakeRoomForWrite(this,SUB81(options,0));
      lVar2 = *(long *)(*(long *)(options + 0x228) + 0x58);
      local_a0 = &local_88;
      if (in_RCX != 0 && (this->super_DB)._vptr_DB == (_func_int **)0x0) {
        b = (MemTable *)BuildBatchGroup((DBImpl *)options,&local_a0);
        WriteBatchInternal::SetSequence((WriteBatch *)b,lVar2 + 1);
        local_c0.rep_.field_2._M_allocated_capacity._4_4_ =
             WriteBatchInternal::Count((WriteBatch *)b);
        pthread_mutex_unlock(__mutex);
        local_c0.rep_._M_dataplus._M_p = (((string *)&b->comparator_)->_M_dataplus)._M_p;
        local_c0.rep_._M_string_length = ((string *)&b->comparator_)->_M_string_length;
        local_c0.rep_.field_2._8_8_ = b;
        log::Writer::AddRecord((Writer *)local_90,*(Slice **)(options + 0x158));
        (this->super_DB)._vptr_DB = (_func_int **)local_90;
        if ((local_90 == (undefined1  [8])0x0) &&
           (*(char *)&(local_98->rep_)._M_dataplus._M_p == '\x01')) {
          (**(code **)(**(long **)(options + 0x148) + 0x28))(&local_c0);
          (this->super_DB)._vptr_DB = (_func_int **)local_c0.rep_._M_dataplus._M_p;
          bVar11 = (Writer *)local_c0.rep_._M_dataplus._M_p != (Writer *)0x0;
        }
        else {
          bVar11 = false;
        }
        if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
          WriteBatchInternal::InsertInto(&local_c0,(MemTable *)local_c0.rep_.field_2._8_8_);
          (this->super_DB)._vptr_DB = (_func_int **)local_c0.rep_._M_dataplus._M_p;
        }
        iVar6 = pthread_mutex_lock(__mutex);
        if (iVar6 != 0) goto LAB_0013a91d;
        lVar10 = (long)(int)local_c0.rep_.field_2._M_allocated_capacity._4_4_;
        if (bVar11) {
          RecordBackgroundError((DBImpl *)options,(Status *)this);
        }
        uVar9 = lVar2 + lVar10;
        if ((MemTable *)local_c0.rep_.field_2._8_8_ == *(MemTable **)(options + 0x1b8)) {
          WriteBatch::Clear((WriteBatch *)*(MemTable **)(options + 0x1b8));
        }
        if (uVar9 < *(ulong *)(*(long *)(options + 0x228) + 0x58)) {
          __assert_fail("s >= last_sequence_",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/./db/version_set.h"
                        ,0xd8,"void leveldb::VersionSet::SetLastSequence(uint64_t)");
        }
        *(ulong *)(*(long *)(options + 0x228) + 0x58) = uVar9;
      }
      pWVar1 = local_a0;
      pp_Var7 = (this->super_DB)._vptr_DB;
      do {
        pWVar3 = (Writer *)**(long **)(options + 0x178);
        std::deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_>::pop_front
                  ((deque<leveldb::DBImpl::Writer_*,_std::allocator<leveldb::DBImpl::Writer_*>_> *)
                   (options + 0x168));
        if (pWVar3 != &local_88) {
          pp_Var4 = (_func_int **)(pWVar3->status).state_;
          if (pp_Var4 != pp_Var7) {
            if (pp_Var4 != (_func_int **)0x0) {
              operator_delete__(pp_Var4);
            }
            if (pp_Var7 == (_func_int **)0x0) {
              pcVar8 = (char *)0x0;
            }
            else {
              pcVar8 = Status::CopyState((char *)pp_Var7);
            }
            (pWVar3->status).state_ = pcVar8;
          }
          pWVar3->done = true;
          std::condition_variable::notify_one();
        }
      } while (pWVar3 != pWVar1);
      if (*(long *)(options + 0x198) != *(long *)(options + 0x178)) {
        std::condition_variable::notify_one();
      }
    }
    else {
LAB_0013a6f1:
      if (local_88.status.state_ == (char *)0x0) {
        pp_Var7 = (_func_int **)0x0;
      }
      else {
        pp_Var7 = (_func_int **)Status::CopyState(local_88.status.state_);
      }
      (this->super_DB)._vptr_DB = pp_Var7;
    }
    pthread_mutex_unlock(__mutex);
    std::condition_variable::~condition_variable(&local_88.cv.cv_);
    if (local_88.status.state_ != (char *)0x0) {
      operator_delete__(local_88.status.state_);
    }
    return (Status)(char *)this;
  }
LAB_0013a91d:
  std::__throw_system_error(iVar6);
}

Assistant:

Status DBImpl::Write(const WriteOptions& options, WriteBatch* updates) {
  Writer w(&mutex_);
  w.batch = updates;
  w.sync = options.sync;
  w.done = false;

  //LevelDB加锁保证同一时刻只能有一个Writer工作。其他Writer挂起等待，直到前一个Writer执行完毕后唤醒。
  MutexLock l(&mutex_);
  writers_.push_back(&w);
  while (!w.done && &w != writers_.front()) {
    w.cv.Wait();
  }
  if (w.done) {
    return w.status;
  }

  // May temporarily unlock and wait.
  Status status = MakeRoomForWrite(updates == nullptr);//做一些写入前的check，包括如是不是该停写，是不是该切memtable，是不是该compact等
  uint64_t last_sequence = versions_->LastSequence();//获取最大的序列号
  Writer* last_writer = &w;// laster_writer的意思是打包多个write中的最后一个writer
  if (status.ok() && updates != nullptr) {  // nullptr batch is for compactions
    WriteBatch* write_batch = BuildBatchGroup(&last_writer);//这个函数要拿出来，重点说一下
    // 这里要联系到上边的 MutexLock l(&mutex_); 下边的那段代码：
    // 合并writers里多个writer的WriteBatch，就是上面write deque里阻塞住的writer完成他们的任务
    // 第一个进来的写操作会在真正写log文件和写memtable时候把锁放掉，
    // 这时候别的写操作会进来把自己push到writes_的deque中，然后挂起在自己的条件锁上（ w.cv.Wait();）
    // 为什么呢？因为此时自己的done不是true并且自己不是deque中的第一个writer，
    // 等第一个writer全部操作完之后呢，会把此时deque中的所有writer唤醒,为什么醒了之后第一步是判断自己是不是done呢，自己还没执行怎么可能会done呢
    // 其实这就是leveldb的优化，当前抢到锁进来的writer会在真正操作之前把此时deque中所有的writer的任务都拿过来（实际上不是全拿过来，有数量限制），
    // 然后帮他们都做了，并且把结果放回至每个writer对应的status中，最后再唤醒所有writer，所以这些writer醒来后发现自己的任务已经被做了，就直接拿自己的返回值返回了

    WriteBatchInternal::SetSequence(write_batch, last_sequence + 1);//本次写入对应的序列号
    last_sequence += WriteBatchInternal::Count(write_batch);//更新last_sequence，加的个数等于此次是WriteBatch中操作的个数

    // Add to log and apply to memtable.  We can release the lock
    // during this phase since &w is currently responsible for logging
    // and protects against concurrent loggers and concurrent writes
    // into mem_.
    {
      mutex_.Unlock();//写log和写memtable时可以放锁，让别的write进入deque，以减少互斥时间
      status = log_->AddRecord(WriteBatchInternal::Contents(write_batch));
      bool sync_error = false;
      if (status.ok() && options.sync) {
        status = logfile_->Sync();
        if (!status.ok()) {
          sync_error = true;
        }
      }
      if (status.ok()) {
        status = WriteBatchInternal::InsertInto(write_batch, mem_);
      }
      mutex_.Lock();//再次加锁，互斥的更新versions的last_sequence
      if (sync_error) {
        // The state of the log file is indeterminate: the log record we
        // just added may or may not show up when the DB is re-opened.
        // So we force the DB into a mode where all future writes fail.
        RecordBackgroundError(status);
      }
    }
    if (write_batch == tmp_batch_) tmp_batch_->Clear();

    versions_->SetLastSequence(last_sequence);
  }

  //从deque的第一个writer开始pop，第一个writer一定是当前操作的writer，
  //直到pop到本次打包的最后一个writer
  while (true) {
    Writer* ready = writers_.front();
    writers_.pop_front();
    if (ready != &w) {
      ready->status = status;
      ready->done = true;
      ready->cv.Signal();
    }
    if (ready == last_writer) break;
  }

  // Notify new head of write queue
  //唤醒此时的deque头writer，从它开始进行接下来的写入
  if (!writers_.empty()) {
    writers_.front()->cv.Signal();
  }

  return status;
}